

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paex_pink.c
# Opt level: O2

int main(void)

{
  FILE *__stream;
  uint errorCode;
  PaDeviceInfo *pPVar1;
  char *pcVar2;
  int iVar3;
  bool bVar4;
  float fVar5;
  PaStream *stream;
  PaStreamParameters outputParameters;
  paTestData data;
  
  InitializePinkNoise(&data.leftPink,0xc);
  InitializePinkNoise(&data.rightPink,0x10);
  iVar3 = 0x14;
  while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    fVar5 = GeneratePinkNoise(&data.leftPink);
    printf("Pink = %f\n",(double)fVar5);
  }
  data.sampsToGo = 0x285ff0;
  errorCode = Pa_Initialize();
  if (errorCode == 0) {
    outputParameters.device = Pa_GetDefaultOutputDevice();
    if (outputParameters.device == -1) {
      fwrite("Error: No default output device.\n",0x21,1,_stderr);
      errorCode = 0;
    }
    else {
      outputParameters.channelCount = 2;
      outputParameters.hostApiSpecificStreamInfo = (void *)0x0;
      outputParameters.sampleFormat = 1;
      pPVar1 = Pa_GetDeviceInfo(outputParameters.device);
      outputParameters.suggestedLatency = pPVar1->defaultLowOutputLatency;
      errorCode = Pa_OpenStream(&stream,(PaStreamParameters *)0x0,&outputParameters,44100.0,0x800,1,
                                patestCallback,&data);
      if ((errorCode == 0) && (errorCode = Pa_StartStream(stream), errorCode == 0)) {
        puts("Stereo pink noise for one minute...");
        while (errorCode = Pa_IsStreamActive(stream), errorCode == 1) {
          Pa_Sleep(100);
        }
        if ((-1 < (int)errorCode) && (errorCode = Pa_CloseStream(stream), errorCode == 0)) {
          printf("Pink min = %f, max = %f\n",(double)pinkMin,(double)pinkMax);
          Pa_Terminate();
          return 0;
        }
      }
    }
  }
  Pa_Terminate();
  fwrite("An error occured while using the portaudio stream\n",0x32,1,_stderr);
  fprintf(_stderr,"Error number: %d\n",(ulong)errorCode);
  __stream = _stderr;
  pcVar2 = Pa_GetErrorText(errorCode);
  fprintf(__stream,"Error message: %s\n",pcVar2);
  return 0;
}

Assistant:

int main(void)
{
    PaStream*           stream;
    PaError             err;
    paTestData          data;
    PaStreamParameters  outputParameters;
    int                 totalSamps;
    static const double SR  = 44100.0;
    static const int    FPB = 2048; /* Frames per buffer: 46 ms buffers. */
    
    /* Initialize two pink noise signals with different numbers of rows. */
    InitializePinkNoise( &data.leftPink,  12 );
    InitializePinkNoise( &data.rightPink, 16 );

    /* Look at a few values. */
    {
        int i;
        float pink;
        for( i=0; i<20; i++ )
        {
            pink = GeneratePinkNoise( &data.leftPink );
            printf("Pink = %f\n", pink );
        }
    }

    data.sampsToGo = totalSamps = (int)(60.0 * SR);   /* Play a whole minute. */
    err = Pa_Initialize();
    if( err != paNoError ) goto error;

    /* Open a stereo PortAudio stream so we can hear the result. */
    outputParameters.device = Pa_GetDefaultOutputDevice(); /* Take the default output device. */
    if (outputParameters.device == paNoDevice) {
      fprintf(stderr,"Error: No default output device.\n");
      goto error;
    }
    outputParameters.channelCount = 2;                     /* Stereo output, most likely supported. */
    outputParameters.hostApiSpecificStreamInfo = NULL;
    outputParameters.sampleFormat = paFloat32;             /* 32 bit floating point output. */
    outputParameters.suggestedLatency =
                     Pa_GetDeviceInfo(outputParameters.device)->defaultLowOutputLatency;
    err = Pa_OpenStream(&stream,
                        NULL,                              /* No input. */
                        &outputParameters,
                        SR,                                /* Sample rate. */
                        FPB,                               /* Frames per buffer. */
                        paClipOff, /* we won't output out of range samples so don't bother clipping them */
                        patestCallback,
                        &data);
    if( err != paNoError ) goto error;

    err = Pa_StartStream( stream );
    if( err != paNoError ) goto error;

    printf("Stereo pink noise for one minute...\n");

    while( ( err = Pa_IsStreamActive( stream ) ) == 1 ) Pa_Sleep(100);
    if( err < 0 ) goto error;

    err = Pa_CloseStream( stream );
    if( err != paNoError ) goto error;
#ifdef PINK_MEASURE
    printf("Pink min = %f, max = %f\n", pinkMin, pinkMax );
#endif
    Pa_Terminate();
    return 0;
error:
    Pa_Terminate();
    fprintf( stderr, "An error occured while using the portaudio stream\n" );
    fprintf( stderr, "Error number: %d\n", err );
    fprintf( stderr, "Error message: %s\n", Pa_GetErrorText( err ) );
    return 0;
}